

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cc
# Opt level: O0

void __thiscall
kratos::AssignmentTypeBlockVisitor::visit(AssignmentTypeBlockVisitor *this,FunctionStmtBlock *block)

{
  bool bVar1;
  IRNode *root;
  undefined1 local_70 [8];
  AssignmentTypeVisitor visitor;
  Generator *parent;
  FunctionStmtBlock *block_local;
  AssignmentTypeBlockVisitor *this_local;
  
  visitor._72_8_ = Stmt::generator_parent((Stmt *)block);
  if (((Generator *)visitor._72_8_ == (Generator *)0x0) ||
     ((bVar1 = Generator::is_cloned((Generator *)visitor._72_8_), !bVar1 &&
      (bVar1 = Generator::external((Generator *)visitor._72_8_), !bVar1)))) {
    AssignmentTypeVisitor::AssignmentTypeVisitor((AssignmentTypeVisitor *)local_70,Blocking,true);
    root = IRNode::ast_node((IRNode *)block);
    IRVisitor::visit_root((IRVisitor *)local_70,root);
    AssignmentTypeVisitor::~AssignmentTypeVisitor((AssignmentTypeVisitor *)local_70);
  }
  return;
}

Assistant:

void visit(FunctionStmtBlock* block) override {
        auto* parent = block->generator_parent();
        if (parent && (parent->is_cloned() || parent->external())) return;
        AssignmentTypeVisitor visitor(AssignmentType::Blocking, true);
        visitor.visit_root(block->ast_node());
    }